

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnBrTableExpr
          (BinaryReaderObjdumpDisassemble *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  uint __val;
  bool bVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  uint uVar5;
  Index IVar6;
  ulong uVar7;
  size_t data_size;
  string __str;
  string buffer;
  char *local_88;
  uint local_80;
  char local_78 [16];
  Offset local_68;
  Offset local_60;
  BinaryReaderObjdumpDisassemble *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_68 = this->current_opcode_offset;
  local_60 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate
             .state)->offset;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_58 = this;
  if (num_targets != 0) {
    uVar7 = 0;
    do {
      __val = target_depths[uVar7];
      cVar3 = '\x01';
      if (9 < __val) {
        uVar5 = __val;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          if (uVar5 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_00127a26;
          }
          if (uVar5 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_00127a26;
          }
          if (uVar5 < 10000) goto LAB_00127a26;
          bVar1 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (bVar1);
        cVar3 = cVar3 + '\x01';
      }
LAB_00127a26:
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_88,local_80,__val);
      pcVar4 = (char *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_88);
      std::__cxx11::string::append(pcVar4);
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != num_targets);
  }
  cVar3 = '\x01';
  if (9 < default_target_depth) {
    IVar6 = default_target_depth;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (IVar6 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_00127ade;
      }
      if (IVar6 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_00127ade;
      }
      if (IVar6 < 10000) goto LAB_00127ade;
      bVar1 = 99999 < IVar6;
      IVar6 = IVar6 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_00127ade:
  data_size = local_60 - local_68;
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_88,local_80,default_target_depth);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_88);
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  LogOpcode(local_58,data_size,"%s",local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnBrTableExpr(
    Index num_targets,
    Index* target_depths,
    Index default_target_depth) {
  Offset immediate_len = state->offset - current_opcode_offset;

  std::string buffer = std::string();
  for (Index i = 0; i < num_targets; i++) {
    buffer.append(std::to_string(target_depths[i])).append(" ");
  }
  buffer.append(std::to_string(default_target_depth));

  LogOpcode(immediate_len, "%s", buffer.c_str());
  return Result::Ok;
}